

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O1

void __thiscall Display::Display(Display *this,char *filebase)

{
  ofstream *this_00;
  long *plVar1;
  long *plVar2;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,filebase,(allocator<char> *)&local_70);
  (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sTitle)._M_dataplus._M_p = (pointer)&(this->sTitle).field_2;
  (this->sTitle)._M_string_length = 0;
  (this->sTitle).field_2._M_local_buf[0] = '\0';
  (this->sUserSettings)._M_dataplus._M_p = (pointer)&(this->sUserSettings).field_2;
  (this->sUserSettings)._M_string_length = 0;
  (this->sUserSettings).field_2._M_local_buf[0] = '\0';
  (this->sXFont)._M_dataplus._M_p = (pointer)&(this->sXFont).field_2;
  (this->sXFont)._M_string_length = 0;
  (this->sXFont).field_2._M_local_buf[0] = '\0';
  (this->sYFont)._M_dataplus._M_p = (pointer)&(this->sYFont).field_2;
  (this->sYFont)._M_string_length = 0;
  (this->sYFont).field_2._M_local_buf[0] = '\0';
  (this->sZFont)._M_dataplus._M_p = (pointer)&(this->sZFont).field_2;
  (this->sZFont)._M_string_length = 0;
  (this->sZFont).field_2._M_local_buf[0] = '\0';
  (this->sXTicFont)._M_dataplus._M_p = (pointer)&(this->sXTicFont).field_2;
  (this->sXTicFont)._M_string_length = 0;
  (this->sXTicFont).field_2._M_local_buf[0] = '\0';
  (this->sYTicFont)._M_dataplus._M_p = (pointer)&(this->sYTicFont).field_2;
  (this->sYTicFont)._M_string_length = 0;
  (this->sYTicFont).field_2._M_local_buf[0] = '\0';
  (this->sZTicFont)._M_dataplus._M_p = (pointer)&(this->sZTicFont).field_2;
  (this->sZTicFont)._M_string_length = 0;
  (this->sZTicFont).field_2._M_local_buf[0] = '\0';
  this->pFile = (ofstream *)0x0;
  this_00 = (ofstream *)operator_new(0x200);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".gnuplot","");
  plVar1 = (long *)std::__cxx11::string::replace
                             ((ulong)local_50,0,(char *)0x0,
                              (ulong)(this->sFileBase)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::ofstream::ofstream(this_00,(char *)local_70,_S_trunc);
  this->pFile = this_00;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  this->nMode = 0;
  return;
}

Assistant:

Display::Display(const char *filebase) : sFileBase( filebase )
{
	pFile = 0;
	pFile = new ofstream( (sFileBase + string(".gnuplot")).c_str(), ios_base::trunc );
	nMode = 0;
}